

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

UniValue *
DetailMaybeArg(CheckFn *check,vector<RPCArg,_std::allocator<RPCArg>_> *params,JSONRPCRequest *req,
              size_t i)

{
  JSONRPCRequest **ppJVar1;
  UniValue *pUVar2;
  const_reference pvVar3;
  long in_FS_OFFSET;
  bool local_41;
  JSONRPCRequest *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_41 = i < (ulong)(((long)(params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>).
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(params->super__Vector_base<RPCArg,_std::allocator<RPCArg>_>)._M_impl
                               .super__Vector_impl_data._M_start) / 0x108);
  local_40 = req;
  inline_check_non_fatal<bool>
            (&local_41,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
             ,0x2b8,"DetailMaybeArg","i < params.size()");
  ppJVar1 = inline_check_non_fatal<JSONRPCRequest_const*&>
                      (&local_40,
                       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/rpc/util.cpp"
                       ,0x2b9,"DetailMaybeArg","req");
  pUVar2 = UniValue::operator[](&(*ppJVar1)->params,i);
  pvVar3 = std::vector<RPCArg,_std::allocator<RPCArg>_>::at(params,i);
  if (check != (CheckFn *)0x0) {
    (*check)(pvVar3);
  }
  if (pUVar2->typ == VNULL) {
    if (*(__index_type *)
         ((long)&(pvVar3->m_fallback).
                 super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                 .
                 super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
                 .
                 super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>
         + 0x58) == '\x02') {
      pUVar2 = std::get<2ul,RPCArg::Optional,std::__cxx11::string,UniValue>(&pvVar3->m_fallback);
    }
    else {
      pUVar2 = (UniValue *)0x0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pUVar2;
  }
  __stack_chk_fail();
}

Assistant:

static const UniValue* DetailMaybeArg(CheckFn* check, const std::vector<RPCArg>& params, const JSONRPCRequest* req, size_t i)
{
    CHECK_NONFATAL(i < params.size());
    const UniValue& arg{CHECK_NONFATAL(req)->params[i]};
    const RPCArg& param{params.at(i)};
    if (check) check(param);

    if (!arg.isNull()) return &arg;
    if (!std::holds_alternative<RPCArg::Default>(param.m_fallback)) return nullptr;
    return &std::get<RPCArg::Default>(param.m_fallback);
}